

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createLightSource_distant(SemanticParser *this,SP *in)

{
  bool bVar1;
  undefined1 uVar2;
  element_type *peVar3;
  element_type *peVar4;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  SP SVar5;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
  *__range1;
  SP light;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffea8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_c8 [36];
  undefined4 local_a4;
  string local_a0 [40];
  string *in_stack_ffffffffffffff88;
  float *in_stack_ffffffffffffff90;
  ParamSet *in_stack_ffffffffffffff98;
  _Self local_40;
  _Self local_38;
  ParamSet *local_30;
  
  __lhs = in_RDI;
  std::make_shared<pbrt::DistantLightSource>();
  peVar3 = std::
           __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x213438);
  peVar4 = std::
           __shared_ptr_access<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x21344e);
  memcpy(&peVar4->transform,&peVar3->transform,0x30);
  peVar3 = std::
           __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x21346e);
  local_30 = &(peVar3->super_Node).super_ParamSet;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                *)in_stack_fffffffffffffea8);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
              *)in_stack_fffffffffffffea8);
  do {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      std::shared_ptr<pbrt::LightSource>::shared_ptr<pbrt::DistantLightSource,void>
                ((shared_ptr<pbrt::LightSource> *)in_stack_fffffffffffffeb0,
                 (shared_ptr<pbrt::DistantLightSource> *)in_stack_fffffffffffffea8);
      local_a4 = 1;
      std::shared_ptr<pbrt::DistantLightSource>::~shared_ptr
                ((shared_ptr<pbrt::DistantLightSource> *)0x21385e);
      SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)__lhs;
      return (SP)SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                 *)0x2134cf);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::__cxx11::string::string(local_a0,(string *)&stack0xffffffffffffff90);
    bVar1 = std::operator==(&in_stack_fffffffffffffeb0->first,(char *)in_stack_fffffffffffffea8);
    if (bVar1) {
      std::
      __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x213529);
      std::__shared_ptr_access<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x21353f);
      syntactic::ParamSet::getParam3f
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      bVar1 = std::operator==(&in_stack_fffffffffffffeb0->first,(char *)in_stack_fffffffffffffea8);
      if (bVar1) {
        std::
        __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2135e3);
        std::__shared_ptr_access<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2135f9);
        syntactic::ParamSet::getParam3f
                  (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      else {
        bVar1 = std::operator==(&in_stack_fffffffffffffeb0->first,(char *)in_stack_fffffffffffffea8)
        ;
        if (bVar1) {
          std::
          __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x213652);
          std::
          __shared_ptr_access<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x213668);
          syntactic::ParamSet::getParam3f
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        }
        else {
          uVar2 = std::operator==(&in_stack_fffffffffffffeb0->first,
                                  (char *)in_stack_fffffffffffffea8);
          if (!(bool)uVar2) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+((char *)__lhs,in_RDI);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(uVar2,in_stack_fffffffffffffeb8),
                           (char *)in_stack_fffffffffffffeb0);
            std::runtime_error::runtime_error(this_00,local_c8);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          peVar3 = std::
                   __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2136c1);
          in_stack_fffffffffffffeb0 =
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
                *)&(peVar3->super_Node).super_ParamSet;
          std::
          __shared_ptr_access<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2136d7);
          syntactic::ParamSet::getParam3f
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        }
      }
    }
    local_a4 = 3;
    std::__cxx11::string::~string(local_a0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(in_stack_fffffffffffffeb0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                  *)in_stack_fffffffffffffeb0);
  } while( true );
}

Assistant:

LightSource::SP SemanticParser::createLightSource_distant
  (pbrt::syntactic::LightSource::SP in)
  {
    DistantLightSource::SP light = std::make_shared<DistantLightSource>();
    light->transform = in->transform.atStart;
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "from") {
        in->getParam3f(&light->from.x,name);
        continue;
      }
      if (name == "to") {
        in->getParam3f(&light->to.x,name);
        continue;
      }
      if (name == "L") {
        in->getParam3f(&light->L.x,name);
        continue;
      }
      if (name == "scale") {
        in->getParam3f(&light->scale.x,name);
        continue;
      }
      throw std::runtime_error("unknown 'distant' light source param '"+name+"'");
    }
    return light;
  }